

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::garbageCollect(SimpSolver *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ClauseAllocator *this_00;
  undefined1 local_30 [8];
  ClauseAllocator to;
  SimpSolver *this_local;
  
  this_00 = &(this->super_Solver).ca;
  to._24_8_ = this;
  uVar1 = ClauseAllocator::size(this_00);
  uVar2 = ClauseAllocator::wasted(this_00);
  ClauseAllocator::ClauseAllocator((ClauseAllocator *)local_30,uVar1 - uVar2);
  to.ra.wasted_._0_1_ = (this->super_Solver).ca.extra_clause_field & 1;
  relocAll(this,(ClauseAllocator *)local_30);
  Solver::relocAll(&this->super_Solver,(ClauseAllocator *)local_30);
  if (1 < (this->super_Solver).verbosity) {
    uVar1 = ClauseAllocator::size(&(this->super_Solver).ca);
    uVar2 = ClauseAllocator::size((ClauseAllocator *)local_30);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",(ulong)(uVar1 << 2),
           (ulong)(uVar2 << 2));
  }
  ClauseAllocator::moveTo((ClauseAllocator *)local_30,&(this->super_Solver).ca);
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)local_30);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}